

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O0

string * __thiscall CompileCommandParser::CommandType::at(CommandType *this,string *k)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  _Self local_30;
  _Self local_28;
  const_iterator i;
  string *k_local;
  CommandType *this_local;
  
  i._M_node = (_Base_ptr)k;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->
               super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ,k);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            );
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    this_local = (CommandType *)&ppVar3->second;
  }
  else {
    if (at(std::__cxx11::string_const&)::emptyString_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&at(std::__cxx11::string_const&)::emptyString_abi_cxx11_);
      if (iVar2 != 0) {
        std::__cxx11::string::string
                  ((string *)&at(std::__cxx11::string_const&)::emptyString_abi_cxx11_);
        __cxa_atexit(std::__cxx11::string::~string,
                     &at(std::__cxx11::string_const&)::emptyString_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&at(std::__cxx11::string_const&)::emptyString_abi_cxx11_);
      }
    }
    this_local = (CommandType *)&at(std::__cxx11::string_const&)::emptyString_abi_cxx11_;
  }
  return (string *)this_local;
}

Assistant:

std::string const& at(std::string const& k) const
      {
      const_iterator i = this->find(k);
      if(i != this->end()) { return i->second; }
      static std::string emptyString;
      return emptyString;
      }